

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.cpp
# Opt level: O0

QStringDecoder * QStringDecoder::decoderForHtml(QByteArrayView data)

{
  long lVar1;
  QByteArrayView data_00;
  QAnyStringView name;
  QByteArrayView data_01;
  bool bVar2;
  QFlagsStorage<QStringConverterBase::Flag> *pQVar3;
  storage_type *in_RDX;
  qsizetype in_RSI;
  QAnyStringView *in_RDI;
  long in_FS_OFFSET;
  QByteArray encodingTag;
  optional<QStringConverter::Encoding> encoding;
  Flag in_stack_ffffffffffffff4c;
  QStringDecoder *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  QFlagsStorage<QStringConverterBase::Flag> in_stack_ffffffffffffff5c;
  QFlagsStorage<QStringConverterBase::Flag> flags;
  QAnyStringView *pQVar4;
  undefined4 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff74 [12];
  char16_t in_stack_ffffffffffffff96;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  data_01.m_data = in_RDX;
  data_01.m_size = in_RSI;
  pQVar4 = in_RDI;
  QStringConverter::encodingForData(data_01,in_stack_ffffffffffffff96);
  bVar2 = std::optional::operator_cast_to_bool((optional<QStringConverter::Encoding> *)0x545bc9);
  if (bVar2) {
    pQVar3 = (QFlagsStorage<QStringConverterBase::Flag> *)
             std::optional<QStringConverter::Encoding>::value
                       ((optional<QStringConverter::Encoding> *)in_stack_ffffffffffffff50);
    flags.i = pQVar3->i;
    QFlags<QStringConverterBase::Flag>::QFlags
              ((QFlags<QStringConverterBase::Flag> *)in_stack_ffffffffffffff50,
               in_stack_ffffffffffffff4c);
    QStringDecoder(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,(Flags)flags.i);
  }
  else {
    data_00.m_data =
         (storage_type *)
         encoding.super__Optional_base<QStringConverter::Encoding,_true,_true>._M_payload.
         super__Optional_payload_base<QStringConverter::Encoding>;
    data_00.m_size = (qsizetype)data.m_data;
    parseHtmlMetaForEncoding(data_00);
    bVar2 = QByteArray::isEmpty((QByteArray *)0x545c67);
    if (bVar2) {
      QFlags<QStringConverterBase::Flag>::QFlags
                ((QFlags<QStringConverterBase::Flag> *)in_stack_ffffffffffffff50,
                 in_stack_ffffffffffffff4c);
      QStringDecoder(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                     (Flags)in_stack_ffffffffffffff5c.i);
    }
    else {
      QAnyStringView::QAnyStringView
                (in_RDI,(QByteArray *)
                        CONCAT44(in_stack_ffffffffffffff5c.i,in_stack_ffffffffffffff58));
      QFlags<QStringConverterBase::Flag>::QFlags
                ((QFlags<QStringConverterBase::Flag> *)in_stack_ffffffffffffff50,
                 in_stack_ffffffffffffff4c);
      name._4_12_ = in_stack_ffffffffffffff74;
      name.field_0._0_4_ = in_stack_ffffffffffffff70;
      QStringDecoder((QStringDecoder *)0x545c9e,name,
                     (QFlagsStorageHelper<QStringConverterBase::Flag,_4>)
                     SUB84((ulong)pQVar4 >> 0x20,0));
    }
    QByteArray::~QByteArray((QByteArray *)0x545cfe);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QStringDecoder *)pQVar4;
  }
  __stack_chk_fail();
}

Assistant:

QStringDecoder QStringDecoder::decoderForHtml(QByteArrayView data)
{
    // determine charset
    std::optional<QStringConverter::Encoding> encoding = encodingForData(data);
    if (encoding)
        // trust the initial BOM
        return QStringDecoder(encoding.value());

    QByteArray encodingTag = parseHtmlMetaForEncoding(data);
    if (!encodingTag.isEmpty())
        return QStringDecoder(encodingTag);

    return QStringDecoder(Utf8);
}